

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O0

IntegrationPointList<3> * anurbs::IntegrationPoints::xiao_gimbutas(size_t degree)

{
  size_type sVar1;
  invalid_argument *this;
  reference pvVar2;
  size_t degree_local;
  
  if (degree != 0) {
    sVar1 = std::
            vector<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>,_std::allocator<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>_>
            ::size((vector<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>,_std::allocator<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>_>
                    *)s_xiao_gimbutas);
    if (degree <= sVar1) {
      pvVar2 = std::
               vector<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>,_std::allocator<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>_>
               ::operator[]((vector<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>,_std::allocator<std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>_>
                             *)s_xiao_gimbutas,degree - 1);
      return pvVar2;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid degree");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static IntegrationPointList<3>& xiao_gimbutas(const size_t degree)
    {
        if (degree < 1 || degree > s_xiao_gimbutas.size()) {
            throw std::invalid_argument("Invalid degree");
        }

        return s_xiao_gimbutas[degree - 1];
    }